

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void undo_build_ssa(gen_ctx_t gen_ctx)

{
  int iVar1;
  ulong local_70;
  size_t i;
  insn_var_iterator_t iter;
  MIR_insn_t insn;
  MIR_reg_t var;
  int op_num;
  ssa_edge_t_conflict next_se;
  ssa_edge_t_conflict se;
  bb_insn_t_conflict next_bb_insn;
  bb_insn_t_conflict bb_insn;
  bb_t_conflict bb;
  gen_ctx_t gen_ctx_local;
  
  bb = (bb_t_conflict)gen_ctx;
  free_fake_bb_insns(gen_ctx->ssa_ctx->arg_bb_insns);
  free_fake_bb_insns(*(VARR_bb_insn_t **)(*(long *)&bb[1].max_int_pressure + 8));
  for (bb_insn = (bb_insn_t_conflict)DLIST_bb_t_head((DLIST_bb_t *)(*(long *)&bb[1].call_p + 0x18));
      bb_insn != (bb_insn_t_conflict)0x0;
      bb_insn = (bb_insn_t_conflict)DLIST_bb_t_next((bb_t_conflict)bb_insn)) {
    for (next_bb_insn = DLIST_bb_insn_t_head((DLIST_bb_insn_t *)&bb_insn->label_disp);
        next_bb_insn != (bb_insn_t_conflict)0x0; next_bb_insn = DLIST_bb_insn_t_next(next_bb_insn))
    {
      iter.op_part_num = (size_t)next_bb_insn->insn;
      insn_var_iterator_init((insn_var_iterator_t *)&i,(MIR_insn_t)iter.op_part_num);
      while (iVar1 = output_insn_var_iterator_next
                               ((gen_ctx_t)bb,(insn_var_iterator_t *)&i,(MIR_reg_t *)&insn,
                                (int *)((long)&insn + 4)), iVar1 != 0) {
        next_se = *(ssa_edge_t_conflict *)(iter.op_part_num + 0x20 + (long)insn._4_4_ * 0x30);
        while (next_se != (ssa_edge_t_conflict)0x0) {
          _var = next_se->next_use;
          free_ssa_edge(next_se);
          next_se = _var;
        }
      }
      for (local_70 = 0; local_70 < *(ulong *)(iter.op_part_num + 0x18) >> 0x20;
          local_70 = local_70 + 1) {
        *(undefined8 *)(iter.op_part_num + 0x20 + local_70 * 0x30) = 0;
      }
    }
  }
  for (bb_insn = (bb_insn_t_conflict)DLIST_bb_t_head((DLIST_bb_t *)(*(long *)&bb[1].call_p + 0x18));
      bb_insn != (bb_insn_t_conflict)0x0;
      bb_insn = (bb_insn_t_conflict)DLIST_bb_t_next((bb_t_conflict)bb_insn)) {
    next_bb_insn = DLIST_bb_insn_t_head((DLIST_bb_insn_t *)&bb_insn->label_disp);
    while (next_bb_insn != (bb_insn_t_conflict)0x0) {
      se = (ssa_edge_t_conflict)DLIST_bb_insn_t_next(next_bb_insn);
      if ((int)*(undefined8 *)&next_bb_insn->insn->field_0x18 == 0xba) {
        gen_delete_insn((gen_ctx_t)bb,next_bb_insn->insn);
      }
      next_bb_insn = (bb_insn_t_conflict)se;
    }
  }
  return;
}

Assistant:

static void undo_build_ssa (gen_ctx_t gen_ctx) {
  bb_t bb;
  bb_insn_t bb_insn, next_bb_insn;
  ssa_edge_t se, next_se;
  int op_num;
  MIR_reg_t var;
  MIR_insn_t insn;
  insn_var_iterator_t iter;

  free_fake_bb_insns (arg_bb_insns);
  free_fake_bb_insns (undef_insns);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
      insn = bb_insn->insn;
      FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
        /* all sse after ssa combine available only from defs */
        for (se = insn->ops[op_num].data; se != NULL; se = next_se) {
          next_se = se->next_use;
          free_ssa_edge (se);
        }
      }
      for (size_t i = 0; i < insn->nops; i++) insn->ops[i].data = NULL;
    }
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = next_bb_insn) {
      next_bb_insn = DLIST_NEXT (bb_insn_t, bb_insn);
      if (bb_insn->insn->code == MIR_PHI) gen_delete_insn (gen_ctx, bb_insn->insn);
    }
}